

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O0

bool __thiscall Refal2::CReceptacle::Replace(CReceptacle *this,CUnitList *keyValue)

{
  bool bVar1;
  CNodeType *key;
  CNode<Refal2::CUnit> *fromNode;
  CUnitNode **ppCVar2;
  CNode<Refal2::CUnit> *toNode;
  CUnitNode *local_30;
  CUnitNode *equalNode;
  CUnitNode *leftBorderNode;
  CUnitList *keyValue_local;
  CReceptacle *this_local;
  
  leftBorderNode = (CUnitNode *)keyValue;
  keyValue_local = &this->data;
  bVar1 = IsValidKeyValue(keyValue);
  if (bVar1) {
    equalNode = (CUnitNode *)0x0;
    local_30 = (CUnitNode *)0x0;
    key = CNodeList<Refal2::CUnit>::GetFirst((CNodeList<Refal2::CUnit> *)leftBorderNode);
    bVar1 = find(this,key,&equalNode,&local_30);
    if (bVar1) {
      fromNode = CNode<Refal2::CUnit>::Next(equalNode);
      ppCVar2 = CUnit::PairedParen(&equalNode->super_CUnit);
      toNode = CNode<Refal2::CUnit>::Prev(*ppCVar2);
      CNodeList<Refal2::CUnit>::Remove((CNodeList<Refal2::CUnit> *)this,fromNode,toNode);
      CNodeList<Refal2::CUnit>::InsertAfter
                ((CNodeList<Refal2::CUnit> *)this,equalNode,
                 (CNodeList<Refal2::CUnit> *)leftBorderNode);
    }
    else {
      burry(this,(CUnitList *)leftBorderNode);
    }
    bVar1 = CNodeList<Refal2::CUnit>::IsEmpty((CNodeList<Refal2::CUnit> *)leftBorderNode);
    if (!bVar1) {
      __assert_fail("keyValue.IsEmpty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                    ,0x22,"bool Refal2::CReceptacle::Replace(CUnitList &)");
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CReceptacle::Replace( CUnitList& keyValue )
{
	if( !IsValidKeyValue( keyValue ) ) {
		return false;
	}
	CUnitNode* leftBorderNode = nullptr;
	CUnitNode* equalNode = nullptr;
	if( find( keyValue.GetFirst(), leftBorderNode, equalNode ) ) {
		data.Remove( leftBorderNode->Next(),
			leftBorderNode->PairedParen()->Prev() );
		data.InsertAfter( leftBorderNode, keyValue );
	} else {
		burry( keyValue );
	}
	assert( keyValue.IsEmpty() );
	return true;
}